

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockNodePreviewDockSetup
               (ImGuiWindow *host_window,ImGuiDockNode *host_node,ImGuiWindow *root_payload,
               ImGuiDockPreviewData *data,bool is_explicit_target,bool is_outer_docking)

{
  ImVec2 *p;
  ImVec2 *pIVar1;
  ImVec2 IVar2;
  int iVar3;
  ImGuiDockNode *pIVar4;
  byte bVar5;
  bool bVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  ImGuiContext *g;
  ImGuiWindow *pIVar9;
  ushort uVar10;
  uint uVar11;
  ulong uVar12;
  ushort uVar13;
  ulong uVar14;
  undefined3 in_register_00000081;
  long lVar15;
  uint uVar16;
  undefined8 extraout_XMM0_Qb;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  ImRect IVar27;
  ImVec2 local_78;
  ImVec2 pos_old;
  ImVec2 local_68;
  undefined4 local_5c;
  ImRect local_58;
  ImVec2 size_old;
  
  pIVar7 = GImGui;
  local_5c = CONCAT31(in_register_00000081,is_explicit_target);
  pIVar4 = root_payload->DockNodeAsHost;
  if (host_node == (ImGuiDockNode *)0x0) {
    pIVar9 = (ImGuiWindow *)0x0;
    uVar11 = 0;
  }
  else {
    pIVar9 = (ImGuiWindow *)host_node;
    if ((host_node->field_0xb1 & 2) == 0) {
      pIVar9 = (ImGuiWindow *)DockNodeGetRootNode(host_node);
    }
    uVar11 = host_node->LocalFlags | host_node->SharedFlags;
  }
  data->IsCenterAvailable = true;
  if ((is_outer_docking) || ((host_node != (ImGuiDockNode *)0x0 && ((uVar11 & 0x10000) != 0)))) {
LAB_001577fd:
    data->IsCenterAvailable = false;
  }
  else if ((host_node == (ImGuiDockNode *)0x0) || ((uVar11 & 4) == 0)) {
    if (host_node != (ImGuiDockNode *)0x0) goto LAB_00157ddc;
    if (pIVar4 != (ImGuiDockNode *)0x0) goto LAB_00157e0a;
  }
  else {
    if ((host_node->LocalFlags & 0x800) != 0) goto LAB_001577fd;
LAB_00157ddc:
    if (pIVar4 != (ImGuiDockNode *)0x0 &&
        ((host_node->Windows).Size != 0 || host_node->ChildNodes[0] != (ImGuiDockNode *)0x0)) {
LAB_00157e0a:
      if ((pIVar4->ChildNodes[0] != (ImGuiDockNode *)0x0) &&
         (pIVar4->OnlyNodeWithWindows == (ImGuiDockNode *)0x0)) goto LAB_001577fd;
    }
  }
  data->IsSidesAvailable = true;
  if (((host_node == (ImGuiDockNode *)0x0) || ((uVar11 & 0x10) == 0)) &&
     ((pIVar7->IO).ConfigDockingNoSplit != true)) {
    if (host_node == (ImGuiDockNode *)0x0 || is_outer_docking) goto LAB_0015782e;
    if ((host_node->ParentNode == (ImGuiDockNode *)0x0) && ((host_node->LocalFlags & 0x800) != 0)) {
      data->IsSidesAvailable = false;
    }
LAB_00157837:
    bVar5 = host_node->field_0xb1 & 8;
  }
  else {
    data->IsSidesAvailable = false;
LAB_0015782e:
    if (host_node != (ImGuiDockNode *)0x0) goto LAB_00157837;
    bVar5 = host_window->HasCloseButton;
  }
  uVar10 = 0x800;
  if (bVar5 == 0) {
    iVar3._0_1_ = root_payload->HasCloseButton;
    iVar3._1_1_ = root_payload->ResizeBorderHeld;
    iVar3._2_2_ = root_payload->BeginCount;
    uVar10 = (ushort)(iVar3 << 0xb);
  }
  uVar10 = uVar10 | (ushort)*(undefined4 *)&(data->FutureNode).field_0xb0 & 0xf7ff;
  *(ushort *)&(data->FutureNode).field_0xb0 = uVar10;
  uVar13 = 0x1000;
  if (host_node == (ImGuiDockNode *)0x0) {
    uVar13 = (ushort)((~host_window->Flags & 0x20U) << 7);
    pIVar9 = host_window;
  }
  *(ushort *)&(data->FutureNode).field_0xb0 = uVar13 | uVar10 & 0xefff;
  (data->FutureNode).Pos = pIVar9->Pos;
  (data->FutureNode).Size = pIVar9->Size;
  data->SplitNode = host_node;
  data->SplitDir = -1;
  data->IsSplitDirExplicit = false;
  if (host_window->Collapsed == false) {
    uVar11 = 0xffffffff;
    p = &(pIVar7->IO).MousePos;
    for (lVar15 = 0xd0; lVar15 != 0x120; lVar15 = lVar15 + 0x10) {
      if (lVar15 == 0xd0) {
        if (data->IsCenterAvailable != false) {
LAB_00157916:
          IVar27 = ImGuiDockNode::Rect(&data->FutureNode);
          fVar21 = IVar27.Max.x - IVar27.Min.x;
          fVar23 = IVar27.Max.y - IVar27.Min.y;
          fVar18 = (float)((ulong)extraout_XMM0_Qb >> 0x20);
          auVar26._4_4_ = fVar23;
          auVar26._0_4_ = fVar21;
          auVar26._8_4_ = in_XMM1_Dc - (float)extraout_XMM0_Qb;
          auVar26._12_4_ = in_XMM1_Dd - fVar18;
          if (fVar23 <= fVar21) {
            auVar26._0_4_ = fVar23;
          }
          fVar22 = GImGui->FontSize;
          fVar24 = auVar26._0_4_ * 0.125;
          uVar16 = -(uint)(fVar24 <= fVar22 * 0.5);
          fVar24 = (float)(uVar16 & (uint)(fVar22 * 0.5) | ~uVar16 & (uint)fVar24);
          fVar19 = fVar22 * 1.5;
          if (fVar24 <= fVar22 * 1.5) {
            fVar19 = fVar24;
          }
          if (is_outer_docking) {
            fVar24 = (float)(int)(fVar19 * 0.8);
            fVar19 = (float)(int)(fVar19 * 1.5);
            fVar25 = (GImGui->Style).FramePadding.y;
            fVar25 = (fVar25 + fVar25 + fVar22 + (GImGui->Style).ItemSpacing.y) * -0.0;
            fVar22 = (float)(int)((fVar21 * 0.5 + fVar25) - fVar24);
            fVar21 = (float)(int)((fVar23 * 0.5 + fVar25) - fVar24);
          }
          else {
            fVar24 = (float)(int)(fVar19 * 0.9);
            fVar19 = (float)(int)fVar19;
            fVar22 = (float)(int)(fVar19 * 2.4);
            fVar21 = fVar22;
          }
          pIVar1 = (ImVec2 *)((long)(data->FutureNode).ChildNodes + lVar15 + -0x18);
          fVar23 = (float)(int)((IVar27.Min.x + IVar27.Max.x) * 0.5);
          fVar25 = (float)(int)((IVar27.Min.y + IVar27.Max.y) * 0.5);
          in_XMM1_Dc = (float)(int)(((float)extraout_XMM0_Qb + in_XMM1_Dc) * 0.0);
          if (lVar15 == 0xd0) {
            fVar17 = fVar23 - fVar19;
            fVar20 = fVar25 - fVar19;
            fVar22 = fVar23 + fVar19;
            fVar24 = fVar25 + fVar19;
LAB_00157a3c:
            pIVar1->x = fVar17;
            pIVar1->y = fVar20;
            pIVar1[1].x = fVar22;
            pIVar1[1].y = fVar24;
          }
          else if (uVar11 < 4) {
            switch(uVar11) {
            case 0:
              fVar17 = (fVar23 - fVar22) - fVar24;
              fVar20 = fVar25 - fVar19;
              fVar22 = (fVar23 - fVar22) + fVar24;
              fVar24 = fVar25 + fVar19;
              break;
            case 1:
              fVar17 = (fVar22 + fVar23) - fVar24;
              fVar20 = fVar25 - fVar19;
              fVar22 = fVar22 + fVar23 + fVar24;
              fVar24 = fVar25 + fVar19;
              break;
            case 2:
              fVar17 = fVar23 - fVar19;
              fVar20 = (fVar25 - fVar21) - fVar24;
              fVar22 = fVar19 + fVar23;
              fVar24 = fVar24 + (fVar25 - fVar21);
              break;
            case 3:
              fVar17 = fVar23 - fVar19;
              fVar20 = (fVar21 + fVar25) - fVar24;
              fVar22 = fVar19 + fVar23;
              fVar24 = fVar24 + fVar21 + fVar25;
            }
            goto LAB_00157a3c;
          }
          local_58.Min = *pIVar1;
          local_58.Max = pIVar1[1];
          in_XMM1_Dd = (float)(int)((fVar18 + in_XMM1_Dd) * 0.0);
          if (is_outer_docking) {
LAB_00157a4d:
            bVar8 = ImRect::Contains(&local_58,p);
            fVar18 = in_XMM1_Dc;
            if (bVar8) {
LAB_00157a5e:
              data->SplitDir = uVar11;
              data->IsSplitDirExplicit = true;
              in_XMM1_Dc = fVar18;
            }
          }
          else {
            fVar18 = (float)(int)(fVar19 * 0.3);
            local_58.Min.y = local_58.Min.y - fVar18;
            local_58.Min.x = local_58.Min.x - fVar18;
            local_58.Max.y = fVar18 + local_58.Max.y;
            local_58.Max.x = fVar18 + local_58.Max.x;
            IVar2 = *p;
            fVar23 = IVar2.x - fVar23;
            in_XMM1_Dc = IVar2.y - fVar25;
            fVar18 = fVar23 * fVar23 + in_XMM1_Dc * in_XMM1_Dc;
            in_XMM1_Dd = in_XMM1_Dc;
            if (fVar19 * 1.4 * fVar19 * 1.4 <= fVar18) {
              if (fVar19 * 2.6 * fVar19 * 2.6 <= fVar18) goto LAB_00157a4d;
              fVar18 = ABS(in_XMM1_Dc);
              uVar16 = (uint)(0.0 < fVar23);
              if (ABS(fVar23) <= fVar18) {
                uVar16 = 0.0 < in_XMM1_Dc | 2;
              }
              in_XMM1_Dc = fVar18;
              in_XMM1_Dd = fVar18;
              if (uVar11 == uVar16) goto LAB_00157a5e;
            }
            else {
              fVar18 = in_XMM1_Dc;
              if (lVar15 == 0xd0) goto LAB_00157a5e;
            }
          }
        }
      }
      else if (data->IsSidesAvailable == true) goto LAB_00157916;
      uVar11 = uVar11 + 1;
    }
    uVar11 = data->SplitDir;
    if (uVar11 == 0xffffffff) goto LAB_00157bee;
    bVar8 = true;
    bVar6 = false;
  }
  else {
LAB_00157bee:
    bVar8 = data->IsCenterAvailable;
    uVar11 = 0xffffffff;
    bVar6 = true;
  }
  data->IsDropAllowed = bVar8;
  if ((((char)local_5c == '\0') && (data->IsSplitDirExplicit == false)) &&
     ((pIVar7->IO).ConfigDockingWithShift == false)) {
    data->IsDropAllowed = false;
  }
  data->SplitRatio = 0.0;
  if (bVar6) {
    return;
  }
  bVar8 = uVar11 < 2;
  uVar12 = (ulong)!bVar8;
  local_68.x = 0.0;
  local_68.y = 0.0;
  pos_old = (data->FutureNode).Pos;
  local_78.x = 0.0;
  local_78.y = 0.0;
  size_old = (data->FutureNode).Size;
  local_58.Min = root_payload->Size;
  fVar21 = (GImGui->Style).ItemInnerSpacing.x;
  (&local_68.x)[bVar8] = (&pos_old.x)[bVar8];
  (&local_78.x)[bVar8] = (&size_old.x)[bVar8];
  uVar14 = (ulong)((uint)!bVar8 * 4);
  fVar23 = *(float *)((long)&size_old.x + uVar14) - fVar21;
  fVar18 = *(float *)((long)&local_58.Min.x + uVar14);
  fVar22 = fVar23 * 0.5;
  if (fVar18 <= 0.0 || fVar22 < fVar18) {
    fVar18 = (float)(int)fVar22;
  }
  *(float *)((long)&local_78.x + uVar14) = fVar18;
  uVar11 = uVar11 & 0xfffffffd;
  if (uVar11 == 0) {
    fVar21 = (&pos_old.x)[uVar12];
  }
  else {
    if (uVar11 != 1) goto LAB_00157d80;
    fVar21 = fVar21 + (float)(int)(fVar23 - fVar18) + (&pos_old.x)[uVar12];
  }
  (&local_68.x)[uVar12] = fVar21;
LAB_00157d80:
  fVar18 = fVar18 / *(float *)((long)(data->FutureNode).ChildNodes + uVar12 * 4 + 0x30);
  fVar21 = 1.0;
  if (fVar18 <= 1.0) {
    fVar21 = fVar18;
  }
  fVar21 = (float)(~-(uint)(fVar18 < 0.0) & (uint)fVar21);
  (data->FutureNode).Pos = local_68;
  (data->FutureNode).Size = local_78;
  if (uVar11 == 1) {
    fVar21 = 1.0 - fVar21;
  }
  data->SplitRatio = fVar21;
  return;
}

Assistant:

static void ImGui::DockNodePreviewDockSetup(ImGuiWindow* host_window, ImGuiDockNode* host_node, ImGuiWindow* root_payload, ImGuiDockPreviewData* data, bool is_explicit_target, bool is_outer_docking)
{
    ImGuiContext& g = *GImGui;

    // There is an edge case when docking into a dockspace which only has inactive nodes.
    // In this case DockNodeTreeFindNodeByPos() will have selected a leaf node which is inactive.
    // Because the inactive leaf node doesn't have proper pos/size yet, we'll use the root node as reference.
    ImGuiDockNode* root_payload_as_host = root_payload->DockNodeAsHost;
    ImGuiDockNode* ref_node_for_rect = (host_node && !host_node->IsVisible) ? DockNodeGetRootNode(host_node) : host_node;
    if (ref_node_for_rect)
        IM_ASSERT(ref_node_for_rect->IsVisible);

    // Filter, figure out where we are allowed to dock
    ImGuiDockNodeFlags host_node_flags = host_node ? host_node->GetMergedFlags() : 0;
    data->IsCenterAvailable = true;
    if (is_outer_docking)
        data->IsCenterAvailable = false;
    else if (host_node && (host_node_flags & ImGuiDockNodeFlags_NoDocking))
        data->IsCenterAvailable = false;
    else if (host_node && (host_node_flags & ImGuiDockNodeFlags_NoDockingInCentralNode) && host_node->IsCentralNode())
        data->IsCenterAvailable = false;
    else if ((!host_node || !host_node->IsEmpty()) && root_payload_as_host && root_payload_as_host->IsSplitNode() && (root_payload_as_host->OnlyNodeWithWindows == NULL)) // Is _visibly_ split?
        data->IsCenterAvailable = false;

    data->IsSidesAvailable = true;
    if ((host_node && (host_node_flags & ImGuiDockNodeFlags_NoSplit)) || g.IO.ConfigDockingNoSplit)
        data->IsSidesAvailable = false;
    else if (!is_outer_docking && host_node && host_node->ParentNode == NULL && host_node->IsCentralNode())
        data->IsSidesAvailable = false;

    // Build a tentative future node (reuse same structure because it is practical. Shape will be readjusted when previewing a split)
    data->FutureNode.HasCloseButton = (host_node ? host_node->HasCloseButton : host_window->HasCloseButton) || (root_payload->HasCloseButton);
    data->FutureNode.HasWindowMenuButton = host_node ? true : ((host_window->Flags & ImGuiWindowFlags_NoCollapse) == 0);
    data->FutureNode.Pos = host_node ? ref_node_for_rect->Pos : host_window->Pos;
    data->FutureNode.Size = host_node ? ref_node_for_rect->Size : host_window->Size;

    // Calculate drop shapes geometry for allowed splitting directions
    IM_ASSERT(ImGuiDir_None == -1);
    data->SplitNode = host_node;
    data->SplitDir = ImGuiDir_None;
    data->IsSplitDirExplicit = false;
    if (!host_window->Collapsed)
        for (int dir = ImGuiDir_None; dir < ImGuiDir_COUNT; dir++)
        {
            if (dir == ImGuiDir_None && !data->IsCenterAvailable)
                continue;
            if (dir != ImGuiDir_None && !data->IsSidesAvailable)
                continue;
            if (DockNodeCalcDropRectsAndTestMousePos(data->FutureNode.Rect(), (ImGuiDir)dir, data->DropRectsDraw[dir+1], is_outer_docking, &g.IO.MousePos))
            {
                data->SplitDir = (ImGuiDir)dir;
                data->IsSplitDirExplicit = true;
            }
        }

    // When docking without holding Shift, we only allow and preview docking when hovering over a drop rect or over the title bar
    data->IsDropAllowed = (data->SplitDir != ImGuiDir_None) || (data->IsCenterAvailable);
    if (!is_explicit_target && !data->IsSplitDirExplicit && !g.IO.ConfigDockingWithShift)
        data->IsDropAllowed = false;

    // Calculate split area
    data->SplitRatio = 0.0f;
    if (data->SplitDir != ImGuiDir_None)
    {
        ImGuiDir split_dir = data->SplitDir;
        ImGuiAxis split_axis = (split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Right) ? ImGuiAxis_X : ImGuiAxis_Y;
        ImVec2 pos_new, pos_old = data->FutureNode.Pos;
        ImVec2 size_new, size_old = data->FutureNode.Size;
        DockNodeCalcSplitRects(pos_old, size_old, pos_new, size_new, split_dir, root_payload->Size);

        // Calculate split ratio so we can pass it down the docking request
        float split_ratio = ImSaturate(size_new[split_axis] / data->FutureNode.Size[split_axis]);
        data->FutureNode.Pos = pos_new;
        data->FutureNode.Size = size_new;
        data->SplitRatio = (split_dir == ImGuiDir_Right || split_dir == ImGuiDir_Down) ? (1.0f - split_ratio) : (split_ratio);
    }
}